

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

void __thiscall ON_SubDQuadNeighborhood::SetPatchStatus(ON_SubDQuadNeighborhood *this,uint fvi0)

{
  ON_SubDFace *this_00;
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *this_01;
  ON_SubDEdge *this_02;
  uint uVar2;
  ON_2dex max_face_grid_dex_00;
  ON_2dex min_face_grid_dex_00;
  int iVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint corner_index_1;
  ulong uVar7;
  ON_SubDEdge *pOVar8;
  ulong uVar9;
  undefined *puVar10;
  uint uVar11;
  uint i;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint corner_index;
  long lVar15;
  ulong uVar16;
  ON_SubDFace *(*papOVar17) [3];
  ON_SubDEdge *(*papOVar18) [2];
  uchar uVar19;
  double dVar20;
  bool bExtraordinaryCornerVertex [4];
  bool bCenterEdgeIsSmooth [4];
  bool bCenterEdgeIsCrease [4];
  bool bQuadVertexIsSmoothOrCrease [4];
  ON_2dex max_face_grid_dex;
  ON_2dex min_face_grid_dex;
  ON_SubDVertex *quad_vertex [4];
  char acStack_af [3];
  bool local_ac;
  char acStack_ab [18];
  bool local_99;
  undefined8 local_98;
  ON_SubDVertex *local_90;
  int local_84;
  ON_SubDFace *(*local_80) [3];
  ON_SubDEdge *(*local_78) [2];
  ON_2dex local_70;
  ON_2dex local_68;
  ulong local_60;
  ON_SubDVertex *local_58 [5];
  
  this->m_bIsCubicPatch = false;
  iVar12 = (uint)this->m_current_subdivision_level - (uint)this->m_initial_subdivision_level;
  if (this->m_current_subdivision_level <= this->m_initial_subdivision_level) {
    iVar12 = 0;
  }
  ON_2dex::ON_2dex(&local_68,0,0);
  ON_2dex::ON_2dex(&local_70,3,3);
  this->m_boundary_crease_count = '\0';
  uVar19 = this->m_bBoundaryCrease[0] == true;
  if ((bool)uVar19) {
    this->m_boundary_crease_count = '\x01';
    local_68.j = local_68.j + 1;
  }
  if (this->m_bBoundaryCrease[1] == true) {
    uVar19 = uVar19 + '\x01';
    this->m_boundary_crease_count = uVar19;
    local_70.i = local_70.i + -1;
  }
  if (this->m_bBoundaryCrease[2] == true) {
    uVar19 = uVar19 + '\x01';
    this->m_boundary_crease_count = uVar19;
    local_70.j = local_70.j + -1;
  }
  if (this->m_bBoundaryCrease[3] == true) {
    this->m_boundary_crease_count = uVar19 + '\x01';
    local_68.i = local_68.i + 1;
  }
  uVar7 = (ulong)(fvi0 + 1 & 3);
  uVar9 = (ulong)(fvi0 - 1 & 3);
  acStack_ab[7] = '\0';
  acStack_ab[8] = '\0';
  acStack_ab[9] = '\0';
  acStack_ab[10] = '\0';
  papOVar17 = (ON_SubDFace *(*) [3])(ulong)fvi0;
  bVar4 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[(long)papOVar17]);
  (&stack0x00000004)[(long)(papOVar17 + -7)] = bVar4;
  uVar16 = (ulong)(fvi0 & 3 ^ 2);
  if (iVar12 == 0) {
    bVar4 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar7]);
    acStack_af[uVar7 + 0xb] = bVar4;
    bVar4 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar16]);
  }
  else {
    acStack_af[uVar7 + 0xb] = '\x01';
    bVar4 = true;
  }
  local_98 = (ON_SubDVertex *)uVar16;
  acStack_af[uVar16 + 0xb] = bVar4;
  bVar4 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar9]);
  acStack_af[uVar9 + 0xb] = bVar4;
  acStack_ab[0xb] = '\0';
  acStack_ab[0xc] = '\0';
  acStack_ab[0xd] = '\0';
  acStack_ab[0xe] = '\0';
  if ((&stack0x00000004)[(long)(papOVar17 + -7)] == '\0') {
    bVar5 = ON_SubDEdge::IsCrease(this->m_center_edges[(long)papOVar17]);
  }
  else {
    bVar5 = false;
  }
  (&stack0x00000008)[(long)(papOVar17 + -7)] = bVar5;
  local_60 = uVar7;
  if (iVar12 == 0) {
    bVar5 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar7]);
    acStack_af[uVar7 + 0xf] = bVar5;
    uVar16 = (ulong)local_98;
    bVar5 = ON_SubDEdge::IsCrease(this->m_center_edges[(long)local_98]);
  }
  else {
    acStack_af[uVar7 + 0xf] = '\0';
    bVar5 = false;
    uVar16 = (ulong)local_98;
  }
  acStack_af[uVar16 + 0xf] = bVar5;
  local_80 = papOVar17;
  if (bVar4) {
    bVar4 = false;
  }
  else {
    bVar4 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar9]);
  }
  uVar16 = local_60;
  local_84 = iVar12;
  acStack_af[uVar9 + 0xf] = bVar4;
  pOVar8 = this->m_center_edges[0];
  bVar4 = true;
  if (pOVar8 != (ON_SubDEdge *)0x0) {
    uVar7 = 0;
    do {
      if (((pOVar8->m_edge_tag == SmoothX) || (acStack_af[uVar7 + 0xb] == acStack_af[uVar7 + 0xf]))
         || (bVar4 = uVar7 < 3, uVar7 == 3)) break;
      pOVar8 = this->m_center_edges[uVar7 + 1];
      uVar7 = uVar7 + 1;
    } while (pOVar8 != (ON_SubDEdge *)0x0);
  }
  local_90 = (ON_SubDVertex *)uVar9;
  this->m_sharp_edge_count = '\0';
  acStack_ab[3] = '\0';
  acStack_ab[4] = '\0';
  acStack_ab[5] = '\0';
  acStack_ab[6] = '\0';
  local_78 = this->m_edge_grid;
  lVar15 = -8;
  lVar14 = 0;
  do {
    if ((this->m_center_edges[lVar14] != (ON_SubDEdge *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar14]), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      builtin_strncpy(acStack_ab + 3,"\x01\x01\x01\x01",4);
    }
    this_00 = this->m_face_grid[0][lVar15];
    iVar12 = (int)lVar14;
    if ((this_00 != (ON_SubDFace *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp((ON_SubDEdge *)this_00), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      acStack_af[lVar14 + 7] = '\x01';
      acStack_af[(ulong)(iVar12 + 1U & 3) + 7] = '\x01';
      acStack_af[(ulong)(iVar12 - 1U & 3) + 7] = '\x01';
    }
    if ((this->m_center_edges[lVar15 + -8] != (ON_SubDEdge *)0x0) &&
       (bVar5 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar15 + -8]), bVar5)) {
      this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
      acStack_af[lVar14 + 7] = '\x01';
      acStack_af[(ulong)(iVar12 + 1U & 3) + 7] = '\x01';
      acStack_af[(ulong)(iVar12 - 1U & 3) + 7] = '\x01';
    }
    lVar14 = lVar14 + 1;
    lVar15 = lVar15 + 2;
  } while (lVar14 != 4);
  bVar5 = local_84 == 0;
  _local_ac = 0;
  bCenterEdgeIsSmooth[(long)*(ON_SubDVertex *(*) [4])(local_80 + -8)] = true;
  bVar6 = bVar5 | bVar4;
  acStack_af[uVar16 + 3] = bVar6;
  acStack_af[(long)local_98 + 3] = bVar6;
  acStack_af[(long)local_90 + 3] = acStack_af[uVar16 + 3];
  pOVar1 = this->m_vertex_grid[1][1];
  local_58[0] = pOVar1;
  this_01 = this->m_vertex_grid[2][1];
  local_58[1] = this_01;
  local_90 = this->m_vertex_grid[2][2];
  local_58[2] = local_90;
  local_98 = this->m_vertex_grid[1][2];
  local_58[3] = local_98;
  lVar14 = 0;
  do {
    dVar20 = ON_SubDVertex::VertexSharpness(local_58[lVar14]);
    if (0.0 < dVar20) {
      acStack_af[lVar14 + 7] = '\x01';
      acStack_af[(ulong)((int)lVar14 + 1U & 3) + 7] = '\x01';
      acStack_af[(ulong)((int)lVar14 - 1U & 3) + 7] = '\x01';
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  uVar13 = 0x56;
  uVar11 = 0x56;
  if (bVar4 == false) {
    acStack_ab[0xf] = ON_SubDVertex::IsSmoothOrCrease(pOVar1);
    acStack_ab[0x10] = ON_SubDVertex::IsSmoothOrCrease(this_01);
    acStack_ab[0x11] = ON_SubDVertex::IsSmoothOrCrease(local_90);
    local_99 = ON_SubDVertex::IsSmoothOrCrease(local_98);
    local_80 = this->m_face_grid;
    local_90 = (ON_SubDVertex *)CONCAT44(local_90._4_4_,0x56);
    uVar16 = 0;
    local_98 = (ON_SubDVertex *)CONCAT44(local_98._4_4_,0x56);
    papOVar18 = local_78;
    do {
      if (acStack_af[uVar16 + 3] != '\0') {
        pOVar1 = local_58[uVar16];
        bVar4 = ON_SubDVertex::IsDart(pOVar1);
        if (!bVar4) {
          iVar12 = (int)uVar16;
          uVar13 = iVar12 + 1U & 3;
          if (acStack_af[(ulong)uVar13 + 0x13] != '\0') {
            uVar11 = iVar12 - 1U & 3;
            uVar9 = (ulong)uVar11;
            if (acStack_af[uVar9 + 0x13] != '\0') {
              if ((acStack_af[uVar16 + 0xb] == '\x01') && (acStack_af[uVar9 + 0xb] == '\x01')) {
                bVar4 = IsOrdinarySmoothQuadCornerVertex(pOVar1);
                if (bVar4) {
LAB_006187ad:
                  acStack_af[uVar16 + 3] = '\0';
                }
              }
              else if ((acStack_af[uVar16 + 0xf] == '\x01') && (acStack_af[uVar9 + 0xb] == '\x01'))
              {
                bVar4 = ON_SubDVertex::IsCrease(pOVar1);
                if (((bVar4) &&
                    (pOVar8 = *(ON_SubDEdge **)((long)*local_78 + (ulong)(uVar11 << 4) + 8),
                    pOVar8 != (ON_SubDEdge *)0x0)) && (bVar4 = ON_SubDEdge::IsCrease(pOVar8), bVar4)
                   ) {
                  lVar14 = *(long *)(&DAT_006d3ac8 + uVar9 * 8);
                  uVar9 = (ulong)uVar11;
                  puVar10 = &DAT_006d3ae8;
LAB_00618866:
                  lVar15 = *(long *)(puVar10 + uVar9 * 8);
LAB_00618945:
                  if ((local_80[lVar14][lVar15] != (ON_SubDFace *)0x0) &&
                     (local_80[lVar14][lVar15]->m_edge_count == 4)) goto LAB_006187ad;
                }
              }
              else if ((acStack_af[uVar16 + 0xb] == '\0') || (acStack_af[uVar9 + 0xf] != '\x01')) {
                if ((acStack_af[uVar16 + 0xf] != '\0') &&
                   (((acStack_af[uVar9 + 0xf] == '\x01' &&
                     (((bVar4 = ON_SubDVertex::IsCrease(pOVar1), bVar4 ||
                       (bVar4 = ON_SubDVertex::IsCorner(pOVar1), bVar4)) &&
                      (bVar4 = ON_SubDVertex::IsCrease(local_58[uVar13]), bVar4)))) &&
                    (bVar4 = ON_SubDVertex::IsCrease(local_58[uVar9]), bVar4)))) {
                  bVar4 = IsOrdinarySmoothQuadCornerVertex(local_58[uVar16 ^ 2]);
                  if (bVar4) {
                    pOVar8 = *(ON_SubDEdge **)((long)*local_78 + (ulong)(uVar13 << 4));
                    this_02 = local_78[uVar16 ^ 2][1];
                    if (((this_02 != (ON_SubDEdge *)0x0 && pOVar8 != (ON_SubDEdge *)0x0) &&
                        (bVar4 = ON_SubDEdge::IsCrease(pOVar8), bVar4)) &&
                       (bVar5 = local_84 != 0, bVar4 = ON_SubDEdge::IsCrease(this_02),
                       bVar4 && bVar5)) {
                      bVar4 = ON_SubDVertex::IsCrease(pOVar1);
                      if (bVar4) {
                        acStack_af[uVar16 + 3] = '\0';
                        local_90 = (ON_SubDVertex *)CONCAT44(local_90._4_4_,iVar12);
                      }
                      else {
                        bVar4 = ON_SubDVertex::IsCorner(pOVar1);
                        iVar3 = (int)local_98;
                        if (bVar4) {
                          iVar3 = iVar12;
                        }
                        local_98 = (ON_SubDVertex *)CONCAT44(local_98._4_4_,iVar3);
                      }
                    }
                  }
                }
              }
              else {
                bVar4 = ON_SubDVertex::IsCrease(pOVar1);
                if (((bVar4) && ((*papOVar18)[0] != (ON_SubDEdge *)0x0)) &&
                   (bVar4 = ON_SubDEdge::IsCrease((*papOVar18)[0]), bVar4)) {
                  if ((uint)(uVar16 - 1) < 3) {
                    uVar9 = uVar16 - 1 & 0xffffffff;
                    lVar14 = 2 - uVar9;
                    puVar10 = &DAT_006d3928;
                    goto LAB_00618866;
                  }
                  lVar14 = 1;
                  lVar15 = 0;
                  goto LAB_00618945;
                }
              }
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
      papOVar18 = papOVar18 + 1;
    } while (uVar16 != 4);
    uVar13 = (uint)local_98;
    uVar11 = (uint)local_90;
  }
  this->m_extraordinary_corner_vertex_count = '\0';
  lVar14 = 0;
  uVar19 = '\0';
  do {
    bVar4 = (bool)acStack_af[lVar14 + 3];
    this->m_bExtraordinaryCornerVertex[lVar14] = bVar4;
    if (bVar4 == true) {
      uVar19 = uVar19 + '\x01';
      this->m_extraordinary_corner_vertex_count = uVar19;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  this->m_exact_quadrant_patch_count = '\0';
  bVar6 = this->m_boundary_crease_count;
  lVar14 = 3;
  uVar19 = '\0';
  do {
    this->m_bExtraordinaryCornerVertex[lVar14 + 2] = false;
    if ((((bVar6 < 3) &&
         ((uVar2 = (uint)lVar14, uVar11 < 4 || bVar6 != 2 ||
          ((uVar13 < 4 && ((uVar2 - 3 ^ uVar13) == 2)))))) && (acStack_af[lVar14 + 4] == '\0')) &&
       (((acStack_af[lVar14] == '\0' && (acStack_af[(ulong)(uVar2 - 2 & 3) + 3] == '\0')) &&
        (acStack_af[(ulong)(uVar2 & 3) + 3] == '\0')))) {
      this->m_bExtraordinaryCornerVertex[lVar14 + 2] = true;
      uVar19 = uVar19 + '\x01';
      this->m_exact_quadrant_patch_count = uVar19;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 7);
  min_face_grid_dex_00.j = local_68.j;
  min_face_grid_dex_00.i = local_68.i;
  max_face_grid_dex_00.j = local_70.j;
  max_face_grid_dex_00.i = local_70.i;
  bVar4 = VertexGridIsExactCubicPatch(this,min_face_grid_dex_00,max_face_grid_dex_00,uVar11);
  this->m_bIsCubicPatch = bVar4;
  return;
}

Assistant:

void ON_SubDQuadNeighborhood::SetPatchStatus(
  const unsigned int fvi0
  )
{
  m_bIsCubicPatch = false;

  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned int delta_subdivision_level 
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? ((unsigned int)(m_current_subdivision_level - m_initial_subdivision_level))
    : 0U;

  ON_2dex min_face_grid_dex = { 0, 0 };
  ON_2dex max_face_grid_dex = { 3, 3 };

  m_boundary_crease_count = 0;
  if (m_bBoundaryCrease[0])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.j++;
  }
  if (m_bBoundaryCrease[1])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.i--;
  }
  if (m_bBoundaryCrease[2])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.j--;
  }
  if (m_bBoundaryCrease[3])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.i++;
  }


  const unsigned int fvi1 = (fvi0+1)%4;
  const unsigned int fvi2 = (fvi0+2)%4;
  const unsigned int fvi3 = (fvi0+3)%4;

  bool bCenterEdgeIsSmooth[4] = {};
  bCenterEdgeIsSmooth[fvi0] = m_center_edges[fvi0]->IsSmoothNotX();
  bCenterEdgeIsSmooth[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi3] = m_center_edges[fvi3]->IsSmoothNotX();

  bool bCenterEdgeIsCrease[4] = {};
  bCenterEdgeIsCrease[fvi0] = bCenterEdgeIsSmooth[fvi0] ? false : m_center_edges[fvi0]->IsCrease();
  bCenterEdgeIsCrease[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi3] = bCenterEdgeIsSmooth[fvi3] ? false : m_center_edges[fvi3]->IsCrease();

  bool bEdgeTagX = false;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (
      nullptr != m_center_edges[i]
      && ON_SubDEdgeTag::SmoothX != m_center_edges[i]->m_edge_tag
      && (bCenterEdgeIsSmooth[i] != bCenterEdgeIsCrease[i])
      )
    {
      continue;
    }
    bEdgeTagX = true;
    break;
  }

  m_sharp_edge_count = 0;
  bool bSharpQuadrant[4] = {};
  for(unsigned int i = 0; i < 4; ++i)
  {
    if (nullptr != m_center_edges[i] && m_center_edges[i]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[0] = true;
      bSharpQuadrant[1] = true;
      bSharpQuadrant[2] = true;
      bSharpQuadrant[3] = true;
    }
    if (nullptr != this->m_edge_grid[i][0] && this->m_edge_grid[i][0]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
    if (nullptr != this->m_edge_grid[i][1] && this->m_edge_grid[i][1]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i % 4U] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
  }

  ////////////////////////////////////////////////////////////////////////////
  //
  // Set 
  //  m_bExtraordinaryCornerVertex[], m_extraordinary_corner_vertex_count
  //  m_bExactQuadrantPatch[], and m_exact_quadrant_patch_count
  // 
  unsigned int boundary_crease_corner_index = 86U;
  unsigned int boundary_corner_corner_index = 86U;

  bool bExtraordinaryCornerVertex[4] = {};
  bExtraordinaryCornerVertex[fvi0] = true;
  bExtraordinaryCornerVertex[fvi1] = (0 == delta_subdivision_level || bEdgeTagX);
  bExtraordinaryCornerVertex[fvi2] = bExtraordinaryCornerVertex[fvi1];
  bExtraordinaryCornerVertex[fvi3] = bExtraordinaryCornerVertex[fvi1];


  const ON_SubDVertex* quad_vertex[4] = {
    m_vertex_grid[1][1],
    m_vertex_grid[2][1],
    m_vertex_grid[2][2],
    m_vertex_grid[1][2]
  };

  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    // Dale Lear 2024 Feb 28 Fix RH-80676
    // Even when bSharpQuadrant[corner_index] is true from tests above,
    // we have to call quad_vertex[corner_index]->VertexSharpness() to
    // insure all sharp edges are taken into account.
    if (quad_vertex[corner_index]->VertexSharpness() > 0.0)
    {
      bSharpQuadrant[corner_index] = true;
      bSharpQuadrant[(corner_index + 1U) % 4U] = true;
      bSharpQuadrant[(corner_index + 3U) % 4U] = true;
    }
  }

  if (false == bEdgeTagX)
  {
    const bool bQuadVertexIsSmoothOrCrease[4] =
    {
      quad_vertex[0]->IsSmoothOrCrease(),
      quad_vertex[1]->IsSmoothOrCrease(),
      quad_vertex[2]->IsSmoothOrCrease(),
      quad_vertex[3]->IsSmoothOrCrease()
    };

    for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
    {
      if (false == bExtraordinaryCornerVertex[corner_index])
        continue;

      if (quad_vertex[corner_index]->IsDart())
        continue;

      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+1)%4])
        continue;
      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+3)%4])
        continue;

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (IsOrdinarySmoothQuadCornerVertex(quad_vertex[corner_index]))
          bExtraordinaryCornerVertex[corner_index] = false;
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[(corner_index + 3) % 4][1];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace((corner_index + 3) % 4);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[corner_index][0];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace(corner_index);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (
          (quad_vertex[corner_index]->IsCrease() || quad_vertex[corner_index]->IsCorner())
          && quad_vertex[(corner_index + 1) % 4]->IsCrease()
          && quad_vertex[(corner_index + 3) % 4]->IsCrease()
          && IsOrdinarySmoothQuadCornerVertex(quad_vertex[(corner_index + 2) % 4])
          )
        {
          const ON_SubDEdge* e1 = m_edge_grid[(corner_index + 1) % 4][0];
          const ON_SubDEdge* e2 = m_edge_grid[(corner_index + 2) % 4][1];
          if (nullptr != e1 && nullptr != e2 && e1->IsCrease() && e2->IsCrease())
          {
            if (delta_subdivision_level > 0)
            {
              if (quad_vertex[corner_index]->IsCrease())
              {
                boundary_crease_corner_index = corner_index;
                bExtraordinaryCornerVertex[corner_index] = false;
              }
              else if ( quad_vertex[corner_index]->IsCorner() )
              {
                boundary_corner_corner_index = corner_index;
              }
            }
          }
        }
        continue;
      }

    }
  }

  m_extraordinary_corner_vertex_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExtraordinaryCornerVertex[corner_index] = bExtraordinaryCornerVertex[corner_index];
    if (bExtraordinaryCornerVertex[corner_index])
      m_extraordinary_corner_vertex_count++;
  }

  m_exact_quadrant_patch_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExactQuadrantPatch[corner_index] = false;
    if (m_boundary_crease_count > 2)
      continue;
    if (2 == m_boundary_crease_count)
    {
      if (boundary_crease_corner_index >= 4)
      {
        if ( boundary_corner_corner_index >= 4 || ((boundary_corner_corner_index+2)%4) != corner_index)
          continue;
      }
    }
    if (bSharpQuadrant[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 1) % 4])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 3) % 4])
      continue;
    m_bExactQuadrantPatch[corner_index] = true;
    m_exact_quadrant_patch_count++;
  }

  // Set m_bIsCubicPatch
  m_bIsCubicPatch = VertexGridIsExactCubicPatch(
    min_face_grid_dex,
    max_face_grid_dex,
    boundary_crease_corner_index
    );
}